

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O3

CURLcode glob_match_url(char **result,char *filename,URLGlob *glob)

{
  char *pcVar1;
  int iVar2;
  CURLcode CVar3;
  curl_off_t *pcVar4;
  size_t sVar5;
  size_t len;
  char *pcVar6;
  curl_off_t num;
  char numbuf [18];
  dynbuf dyn;
  char *local_88;
  long local_80;
  char **local_78;
  curl_off_t *local_70;
  char local_68 [24];
  dynbuf local_50;
  
  *result = (char *)0x0;
  local_88 = filename;
  local_78 = result;
  curlx_dyn_init(&local_50,0x2800);
  local_70 = &glob->pattern[0].content.NumRange.ptr_n;
  pcVar6 = "";
  len = 0;
  do {
    pcVar1 = local_88;
    if (*local_88 == '#') {
      if ((byte)(local_88[1] - 0x30U) < 10) {
        local_88 = local_88 + 1;
        iVar2 = Curl_str_number(&local_88,&local_80,glob->size);
        if (local_80 != 0 && iVar2 == 0) {
          local_80 = local_80 + -1;
          pcVar4 = local_70;
          for (sVar5 = glob->size; sVar5 != 0; sVar5 = sVar5 - 1) {
            if (*(int *)((long)pcVar4 + -0x1c) == (int)local_80) {
              iVar2 = *(int *)(pcVar4 + -4);
              if (iVar2 == 3) {
                pcVar6 = local_68;
                curl_msnprintf(pcVar6,0x12,"%0*ld",*(int *)(pcVar4 + -1),*pcVar4);
              }
              else {
                if (iVar2 == 2) {
                  local_68[0] = *(char *)((long)pcVar4 + -0x16);
                  local_68[1] = 0;
                  len = 1;
                  pcVar6 = local_68;
                  goto LAB_0011e138;
                }
                if (iVar2 != 1) {
                  curl_mfprintf(tool_stderr,"internal error: invalid pattern type (%d)\n");
                  curlx_dyn_free(&local_50);
                  return CURLE_FAILED_INIT;
                }
                if (((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar4 + -3))->min_n == 0)
                goto LAB_0011e138;
                pcVar6 = *(char **)(((anon_struct_40_5_0c6859e6_for_NumRange *)(pcVar4 + -3))->min_n
                                   + (long)*(int *)(pcVar4 + -1) * 8);
              }
              len = strlen(pcVar6);
              goto LAB_0011e138;
            }
            pcVar4 = pcVar4 + 6;
          }
        }
      }
    }
    else if (*local_88 == '\0') {
      CVar3 = curlx_dyn_addn(&local_50,"",0);
      if (CVar3 != CURLE_OK) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar6 = curlx_dyn_ptr(&local_50);
      *local_78 = pcVar6;
      return CURLE_OK;
    }
    local_88 = pcVar1 + 1;
    len = 1;
    pcVar6 = pcVar1;
LAB_0011e138:
    CVar3 = curlx_dyn_addn(&local_50,pcVar6,len);
    if (CVar3 != CURLE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
  } while( true );
}

Assistant:

CURLcode glob_match_url(char **result, const char *filename,
                        struct URLGlob *glob)
{
  char numbuf[18];
  const char *appendthis = "";
  size_t appendlen = 0;
  struct curlx_dynbuf dyn;

  *result = NULL;

  /* We cannot use the glob_buffer for storage since the filename may be
   * longer than the URL we use.
   */
  curlx_dyn_init(&dyn, MAX_OUTPUT_GLOB_LENGTH);

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      const char *ptr = filename;
      curl_off_t num;
      struct URLPattern *pat = NULL;
      filename++;
      if(!curlx_str_number(&filename, &num, glob->size) && num) {
        unsigned long i;
        num--; /* make it zero based */
        /* find the correct glob entry */
        for(i = 0; i < glob->size; i++) {
          if(glob->pattern[i].globindex == (int)num) {
            pat = &glob->pattern[i];
            break;
          }
        }
      }

      if(pat) {
        switch(pat->type) {
        case UPTSet:
          if(pat->content.Set.elements) {
            appendthis = pat->content.Set.elements[pat->content.Set.ptr_s];
            appendlen =
              strlen(pat->content.Set.elements[pat->content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat->content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          msnprintf(numbuf, sizeof(numbuf), "%0*" CURL_FORMAT_CURL_OFF_T,
                    pat->content.NumRange.padlength,
                    pat->content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          fprintf(tool_stderr, "internal error: invalid pattern type (%d)\n",
                  (int)pat->type);
          curlx_dyn_free(&dyn);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(curlx_dyn_addn(&dyn, appendthis, appendlen))
      return CURLE_OUT_OF_MEMORY;
  }

  if(curlx_dyn_addn(&dyn, "", 0))
    return CURLE_OUT_OF_MEMORY;

#if defined(_WIN32) || defined(MSDOS)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, curlx_dyn_ptr(&dyn),
                                         (SANITIZE_ALLOW_PATH |
                                          SANITIZE_ALLOW_RESERVED));
    curlx_dyn_free(&dyn);
    if(sc)
      return CURLE_URL_MALFORMAT;
    *result = sanitized;
    return CURLE_OK;
  }
#else
  *result = curlx_dyn_ptr(&dyn);
  return CURLE_OK;
#endif /* _WIN32 || MSDOS */
}